

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_2> __thiscall
gl4cts::Math::greaterThanEqual<2>(Math *this,Vector<double,_2> *left,Vector<double,_2> *right)

{
  Vector<bool,_2> local_22;
  Vector<double,_2> *local_20;
  Vector<double,_2> *right_local;
  Vector<double,_2> *left_local;
  
  local_20 = right;
  right_local = left;
  left_local = (Vector<double,_2> *)this;
  tcu::greaterThanEqual<double,2>((tcu *)&local_22,left,right);
  convertBvecToUvec<2>(this,&local_22);
  return (Vector<unsigned_int,_2>)(uint  [2])this;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThanEqual(const tcu::Vector<glw::GLdouble, Size>& left,
													   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThanEqual(left, right));
}